

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O1

void __thiscall
Serial::Line<false>::write_internal<false,unsigned_short>
          (Line<false> *this,HalfCycles cycles,int count,unsigned_short levels)

{
  pointer pEVar1;
  long lVar2;
  bool bVar3;
  
  this->remaining_delays_ =
       this->remaining_delays_ + (long)count * (long)cycles.super_WrappedInt<HalfCycles>.length_;
  lVar2 = (long)(this->events_).
                super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->events_).
                super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::resize
            (&this->events_,(long)count * 2 + lVar2);
  if (count != 0) {
    pEVar1 = (this->events_).
             super__Vector_base<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar2 + 1;
    do {
      bVar3 = -1 < (short)levels;
      levels = levels * 2;
      pEVar1[-1].type = Delay;
      pEVar1[-1].delay = (int)cycles.super_WrappedInt<HalfCycles>.length_;
      pEVar1->type = bVar3 + SetHigh;
      pEVar1 = pEVar1 + 2;
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void Line<include_clock>::write_internal(HalfCycles cycles, int count, IntT levels) {
	remaining_delays_ += count * cycles.as_integral();

	auto event = events_.size();
	events_.resize(events_.size() + size_t(count)*2);
	while(count--) {
		events_[event].type = Event::Delay;
		events_[event].delay = int(cycles.as_integral());
		IntT bit;
		if constexpr (lsb_first) {
			bit = levels & 1;
			levels >>= 1;
		} else {
			constexpr auto top_bit = IntT(0x80) << ((sizeof(IntT) - 1) * 8);
			bit = levels & top_bit;
			levels <<= 1;
		}

		events_[event+1].type = bit ? Event::SetHigh : Event::SetLow;
		event += 2;
	}
}